

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

void Scl_LibertyStop(Scl_Tree_t *p,int fVerbose)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  timespec ts;
  timespec local_18;
  
  if (fVerbose != 0) {
    lVar2 = (long)p->nContents + (long)p->nItermAlloc * 0x28;
    auVar3._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar3._0_8_ = lVar2;
    auVar3._12_4_ = 0x45300000;
    printf("Memory = %7.2f MB. ",
           ((auVar3._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * 9.5367431640625e-07);
    Abc_Print(1,"%s =","Time");
    iVar1 = clock_gettime(3,&local_18);
    if (iVar1 < 0) {
      lVar2 = -1;
    }
    else {
      lVar2 = local_18.tv_nsec / 1000 + local_18.tv_sec * 1000000;
    }
    Abc_Print(1,"%9.2f sec\n",(double)(lVar2 - p->clkStart) / 1000000.0);
  }
  if (p->pFileName != (char *)0x0) {
    free(p->pFileName);
    p->pFileName = (char *)0x0;
  }
  if (p->pContents != (char *)0x0) {
    free(p->pContents);
    p->pContents = (char *)0x0;
  }
  if (p->pItems != (Scl_Item_t *)0x0) {
    free(p->pItems);
    p->pItems = (Scl_Item_t *)0x0;
  }
  if (p->pError != (char *)0x0) {
    free(p->pError);
  }
  free(p);
  return;
}

Assistant:

void Scl_LibertyStop( Scl_Tree_t * p, int fVerbose )
{
    if ( fVerbose )
    {
        printf( "Memory = %7.2f MB. ", 1.0 * (p->nContents + p->nItermAlloc * sizeof(Scl_Item_t))/(1<<20) );
        ABC_PRT( "Time", Abc_Clock() - p->clkStart );
    }
    ABC_FREE( p->pFileName );
    ABC_FREE( p->pContents );
    ABC_FREE( p->pItems );
    ABC_FREE( p->pError );
    ABC_FREE( p );
}